

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O3

string * __thiscall
soul::Program::ProgramImpl::getFullyQualifiedTypeDescription_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,Type *type)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_Program.cpp:243:37)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_Program.cpp:243:37)>
             ::_M_manager;
  local_28._M_unused._M_object = this;
  Type::getDescription
            (__return_storage_ptr__,type,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_soul::Structure_&)>
              *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getFullyQualifiedTypeDescription (const Type& type) const
    {
        return type.getDescription ([this] (const Structure& s) { return getStructNameWithQualificationIfNeeded ({}, s); });
    }